

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

FilePath testing::internal::GetCurrentExecutableName(void)

{
  size_t extraout_RDX;
  FilePath *in_RDI;
  FilePath FVar1;
  FilePath local_30;
  undefined1 local_20 [8];
  FilePath result;
  
  FilePath::FilePath((FilePath *)local_20);
  FilePath::FilePath(&local_30,(String *)g_executable_path);
  FilePath::Set((FilePath *)local_20,&local_30);
  FilePath::~FilePath(&local_30);
  FilePath::RemoveDirectoryName(in_RDI);
  FilePath::~FilePath((FilePath *)local_20);
  FVar1.pathname_.length_ = extraout_RDX;
  FVar1.pathname_.c_str_ = (char *)in_RDI;
  return (FilePath)FVar1.pathname_;
}

Assistant:

FilePath GetCurrentExecutableName() {
  FilePath result;

#if GTEST_OS_WINDOWS
  result.Set(FilePath(g_executable_path).RemoveExtension("exe"));
#else
  result.Set(FilePath(g_executable_path));
#endif  // GTEST_OS_WINDOWS

  return result.RemoveDirectoryName();
}